

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
AnalyzeClassDefinition
          (ExpressionContext *ctx,SynClassDefinition *syntax,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  Allocator *allocator;
  IntrusiveList<MatchData> generics_00;
  InplaceStr name;
  IntrusiveList<TypeHandle> generics_01;
  TypeStruct *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  TypeBase *pTVar6;
  TypeGenericClassProto *this;
  ExprGenericClassPrototype *this_00;
  TypeClass **ppTVar7;
  AliasData *pAVar8;
  TypeClass *this_01;
  ExprClassDefinition *this_02;
  SynIdentifier *pSVar9;
  VariableData *this_03;
  MemberHandle *this_04;
  IntrusiveList<MatchData> *this_05;
  MatchData *pMVar10;
  ConstantData *this_06;
  InplaceStr IVar11;
  bool local_389;
  uint local_348;
  undefined8 *local_280;
  ConstantData *el_3;
  MatchData *el_2;
  VariableData *member;
  SynIdentifier *local_258;
  SynIdentifier *nameIdentifier;
  MatchData *pMStack_248;
  uint offset;
  MatchData *el_1;
  ExprClassDefinition *classDefinition;
  MatchData *pMStack_230;
  char *local_228;
  char *pcStack_220;
  SynIdentifier local_210;
  TypeClass *local_1c0;
  TypeClass *classType;
  TypeBase *pTStack_1b0;
  bool extendable;
  TypeBase *type_2;
  MatchData *el;
  TypeClass *baseClass;
  SynIdentifier *currName;
  TypeHandle *currType;
  IntrusiveList<MatchData> actualGenerics;
  ScopeData *pSStack_170;
  uint alignment;
  ScopeData *scope;
  TypeBase *type_1;
  TypeClass *originalDefinition;
  undefined1 auStack_140 [8];
  InplaceStr className;
  SynIdentifier local_110;
  TypeGenericClassProto *local_c0;
  TypeGenericClassProto *genericProtoType;
  TypeClass *originalDefinition_1;
  TypeBase *type;
  SynIdentifier *prev;
  SynIdentifier *curr;
  TraceScope traceScope;
  undefined1 auStack_68 [8];
  InplaceStr typeName;
  TypeGenericClassProto *proto_local;
  SynClassDefinition *syntax_local;
  ExpressionContext *ctx_local;
  IntrusiveList<TypeHandle> generics_local;
  
  IVar11.end = generics.tail;
  ctx_local = (ExpressionContext *)generics.head;
  typeName.end = (syntax->name->name).begin;
  IVar11.begin = (syntax->name->name).end;
  generics_local.head = IVar11.end;
  anon_unknown.dwarf_e7629::CheckTypeConflict
            ((anon_unknown_dwarf_e7629 *)ctx,(ExpressionContext *)syntax,(SynBase *)typeName.end,
             IVar11);
  _auStack_68 = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  if ((AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
       ::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                                   ::token), iVar3 != 0)) {
    AnalyzeClassDefinition::token = NULLC::TraceGetToken("analyze","AnalyzeClassDefinition");
    __cxa_guard_release(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                         ::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&curr,AnalyzeClassDefinition::token);
  NULLC::TraceLabel((char *)auStack_68,typeName.begin);
  if ((proto != (TypeGenericClassProto *)0x0) ||
     (bVar2 = IntrusiveList<SynIdentifier>::empty(&syntax->aliases), bVar2)) {
    uVar4 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)&ctx_local);
    uVar5 = IntrusiveList<SynIdentifier>::size(&syntax->aliases);
    if (uVar4 != uVar5) {
      __assert_fail("generics.size() == syntax->aliases.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x29ba,
                    "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                   );
    }
    bVar2 = IntrusiveList<TypeHandle>::empty((IntrusiveList<TypeHandle> *)&ctx_local);
    IVar11 = _auStack_68;
    if (!bVar2) {
      generics_01.tail = generics_local.head;
      generics_01.head = (TypeHandle *)ctx_local;
      IVar11 = GetGenericClassTypeName(ctx,&proto->super_TypeBase,generics_01);
    }
    className.begin = IVar11.end;
    auStack_140 = (undefined1  [8])IVar11.begin;
    uVar4 = InplaceStr::length((InplaceStr *)auStack_140);
    if (0x2000 < uVar4) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: generated type name exceeds maximum type length \'%d\'",0x2000);
    }
    type_1 = (TypeBase *)0x0;
    uVar4 = InplaceStr::hash((InplaceStr *)auStack_140);
    pTVar6 = anon_unknown.dwarf_e7629::LookupTypeByName(ctx,uVar4);
    if (pTVar6 != (TypeBase *)0x0) {
      type_1 = (TypeBase *)getType<TypeClass>(pTVar6);
      if ((TypeClass *)type_1 == (TypeClass *)0x0) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                   (ulong)(uint)((int)className.begin - auStack_140._0_4_));
      }
      if ((((TypeClass *)type_1)->completed & 1U) != 0) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                   (ulong)(uint)((int)className.begin - auStack_140._0_4_));
      }
      for (pSStack_170 = ctx->scope; pSStack_170 != (ScopeData *)0x0;
          pSStack_170 = pSStack_170->scope) {
        if ((TypeClass *)pSStack_170->ownerType == (TypeClass *)type_1) {
          anon_unknown.dwarf_e7629::Stop
                    (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                     (ulong)(uint)((int)className.begin - auStack_140._0_4_));
        }
      }
    }
    bVar2 = IntrusiveList<TypeHandle>::empty((IntrusiveList<TypeHandle> *)&ctx_local);
    if (!bVar2) {
      uVar4 = InplaceStr::hash((InplaceStr *)auStack_140);
      ppTVar7 = HashMap<TypeClass_*>::find(&ctx->genericTypeMap,uVar4);
      if (ppTVar7 != (TypeClass **)0x0) {
        __assert_fail("ctx.genericTypeMap.find(className.hash()) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x29d7,
                      "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                     );
      }
    }
    if (syntax->align == (SynAlign *)0x0) {
      local_348 = 0;
    }
    else {
      local_348 = AnalyzeAlignment(ctx,syntax->align);
    }
    actualGenerics.tail._4_4_ = local_348;
    IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&currType);
    currName = (SynIdentifier *)ctx_local;
    for (baseClass = (TypeClass *)(syntax->aliases).head;
        currName != (SynIdentifier *)0x0 && baseClass != (TypeClass *)0x0;
        baseClass = (TypeClass *)
                    getType<SynIdentifier>
                              ((SynBase *)(baseClass->super_TypeStruct).super_TypeBase.size)) {
      bVar2 = isType<TypeError>((TypeBase *)(currName->super_SynBase)._vptr_SynBase);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!isType<TypeError>(currType->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x29e4,
                      "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                     );
      }
      pMVar10 = ExpressionContext::get<MatchData>(ctx);
      MatchData::MatchData
                (pMVar10,(SynIdentifier *)baseClass,
                 (TypeBase *)(currName->super_SynBase)._vptr_SynBase);
      IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)&currType,pMVar10);
      currName = *(SynIdentifier **)&(currName->super_SynBase).typeID;
    }
    el = (MatchData *)0x0;
    if (syntax->baseClass != (SynBase *)0x0) {
      ExpressionContext::PushTemporaryScope(ctx);
      for (type_2 = (TypeBase *)currType; type_2 != (TypeBase *)0x0;
          type_2 = (TypeBase *)(type_2->name).begin) {
        pAVar8 = ExpressionContext::get<AliasData>(ctx);
        pSVar9 = (SynIdentifier *)type_2->_vptr_TypeBase;
        pTVar6 = *(TypeBase **)&type_2->typeID;
        uVar4 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar4 + 1;
        AliasData::AliasData(pAVar8,&syntax->super_SynBase,ctx->scope,pTVar6,pSVar9,uVar4);
        ExpressionContext::AddAlias(ctx,pAVar8);
      }
      pTStack_1b0 = AnalyzeType(ctx,syntax->baseClass,true,(bool *)0x0);
      ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY);
      bVar2 = isType<TypeError>(pTStack_1b0);
      if ((!bVar2) &&
         ((el = (MatchData *)getType<TypeClass>(pTStack_1b0), (TypeClass *)el == (TypeClass *)0x0 ||
          ((((TypeClass *)el)->extendable & 1U) == 0)))) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not extendable",
                   (ulong)(uint)(*(int *)&(pTStack_1b0->name).end - (int)(pTStack_1b0->name).begin))
        ;
      }
    }
    local_389 = (syntax->extendable & 1U) != 0 || el != (MatchData *)0x0;
    classType._7_1_ = local_389;
    local_1c0 = (TypeClass *)0x0;
    if (type_1 == (TypeBase *)0x0) {
      this_01 = ExpressionContext::get<TypeClass>(ctx);
      allocator = ctx->allocator;
      local_228 = (char *)auStack_140;
      pcStack_220 = className.begin;
      name.end = className.begin;
      name.begin = (char *)auStack_140;
      SynIdentifier::SynIdentifier(&local_210,syntax->name,name);
      classDefinition = (ExprClassDefinition *)currType;
      pMStack_230 = actualGenerics.head;
      generics_00.tail._0_4_ = (int)actualGenerics.head;
      generics_00.head = (MatchData *)currType;
      generics_00.tail._4_4_ = (int)((ulong)actualGenerics.head >> 0x20);
      TypeClass::TypeClass
                (this_01,allocator,&local_210,&syntax->super_SynBase,ctx->scope,proto,generics_00,
                 (bool)(classType._7_1_ & 1),(TypeClass *)el);
      local_1c0 = this_01;
      SynIdentifier::~SynIdentifier(&local_210);
      ExpressionContext::AddType(ctx,(TypeBase *)local_1c0);
    }
    else {
      local_1c0 = (TypeClass *)type_1;
      *(bool *)&type_1[2].arrayTypes.tail = local_389;
      type_1[2].unsizedArrayType = (TypeUnsizedArray *)el;
    }
    bVar2 = IntrusiveList<TypeHandle>::empty((IntrusiveList<TypeHandle> *)&ctx_local);
    if (!bVar2) {
      uVar4 = InplaceStr::hash((InplaceStr *)auStack_140);
      HashMap<TypeClass_*>::insert(&ctx->genericTypeMap,uVar4,local_1c0);
    }
    this_02 = ExpressionContext::get<ExprClassDefinition>(ctx);
    ExprClassDefinition::ExprClassDefinition(this_02,&syntax->super_SynBase,ctx->typeVoid,local_1c0)
    ;
    el_1 = (MatchData *)this_02;
    ExpressionContext::PushScope(ctx,(TypeBase *)local_1c0);
    (local_1c0->super_TypeStruct).typeScope = ctx->scope;
    for (pMStack_248 = (local_1c0->generics).head; pMStack_248 != (MatchData *)0x0;
        pMStack_248 = pMStack_248->next) {
      pAVar8 = ExpressionContext::get<AliasData>(ctx);
      pSVar9 = pMStack_248->name;
      pTVar6 = pMStack_248->type;
      uVar4 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar4 + 1;
      AliasData::AliasData(pAVar8,&syntax->super_SynBase,ctx->scope,pTVar6,pSVar9,uVar4);
      ExpressionContext::AddAlias(ctx,pAVar8);
    }
    if ((classType._7_1_ & 1) != 0) {
      nameIdentifier._4_4_ =
           anon_unknown.dwarf_e7629::AllocateVariableInScope
                     (ctx,&syntax->super_SynBase,ctx->typeTypeID->alignment,ctx->typeTypeID);
      pSVar9 = ExpressionContext::get<SynIdentifier>(ctx);
      InplaceStr::InplaceStr((InplaceStr *)&member,"$typeid");
      SynIdentifier::SynIdentifier(pSVar9,_member);
      local_258 = pSVar9;
      this_03 = ExpressionContext::get<VariableData>(ctx);
      uVar4 = ctx->typeTypeID->alignment;
      uVar5 = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uVar5 + 1;
      VariableData::VariableData
                (this_03,ctx->allocator,&syntax->super_SynBase,ctx->scope,uVar4,ctx->typeTypeID,
                 local_258,nameIdentifier._4_4_,uVar5);
      ExpressionContext::AddVariable(ctx,this_03,false);
      pTVar1 = &local_1c0->super_TypeStruct;
      this_04 = ExpressionContext::get<MemberHandle>(ctx);
      MemberHandle::MemberHandle(this_04,(SynBase *)0x0,this_03,(SynBase *)0x0);
      IntrusiveList<MemberHandle>::push_back(&pTVar1->members,this_04);
    }
    if (el != (MatchData *)0x0) {
      (local_1c0->super_TypeStruct).super_TypeBase.alignment = *(uint *)((long)&el[1].type + 4);
      for (el_3 = (ConstantData *)el[8].name; el_3 != (ConstantData *)0x0; el_3 = el_3->next) {
        pAVar8 = ExpressionContext::get<AliasData>(ctx);
        pSVar9 = el_3->name;
        pTVar6 = (TypeBase *)el_3->value;
        uVar4 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar4 + 1;
        AliasData::AliasData(pAVar8,&syntax->super_SynBase,ctx->scope,pTVar6,pSVar9,uVar4);
        ExpressionContext::AddAlias(ctx,pAVar8);
        this_05 = &local_1c0->aliases;
        pMVar10 = ExpressionContext::get<MatchData>(ctx);
        MatchData::MatchData(pMVar10,el_3->name,(TypeBase *)el_3->value);
        IntrusiveList<MatchData>::push_back(this_05,pMVar10);
      }
      AddBaseClassMemberVariables(ctx,&syntax->super_SynBase,(TypeClass *)el,local_1c0);
      for (local_280 = *(undefined8 **)&el[3].listed; local_280 != (undefined8 *)0x0;
          local_280 = (undefined8 *)local_280[2]) {
        pTVar1 = &local_1c0->super_TypeStruct;
        this_06 = ExpressionContext::get<ConstantData>(ctx);
        ConstantData::ConstantData(this_06,(SynIdentifier *)*local_280,(ExprBase *)local_280[1]);
        IntrusiveList<ConstantData>::push_back(&pTVar1->constants,this_06);
      }
      anon_unknown.dwarf_e7629::FinalizeAlignment(&local_1c0->super_TypeStruct);
      if ((MatchData *)(local_1c0->super_TypeStruct).super_TypeBase.size != el[1].next) {
        __assert_fail("classType->size == baseClass->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x2a43,
                      "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                     );
      }
    }
    if (syntax->align != (SynAlign *)0x0) {
      (local_1c0->super_TypeStruct).super_TypeBase.alignment = actualGenerics.tail._4_4_;
    }
    AnalyzeClassElements(ctx,(ExprClassDefinition *)el_1,syntax->elements);
    ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    generics_local.tail = (TypeHandle *)el_1;
  }
  else {
    for (prev = (syntax->aliases).head; prev != (SynIdentifier *)0x0;
        prev = getType<SynIdentifier>((prev->super_SynBase).next)) {
      uVar4 = InplaceStr::hash(&prev->name);
      pTVar6 = anon_unknown.dwarf_e7629::LookupTypeByName(ctx,uVar4);
      if (pTVar6 != (TypeBase *)0x0) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,&prev->super_SynBase,
                   "ERROR: there is already a type or an alias with the same name");
      }
      for (type = (TypeBase *)(syntax->aliases).head;
          type != (TypeBase *)0x0 && type != (TypeBase *)prev;
          type = (TypeBase *)getType<SynIdentifier>((SynBase *)type->size)) {
        bVar2 = InplaceStr::operator==((InplaceStr *)&type->refType,&prev->name);
        if (bVar2) {
          anon_unknown.dwarf_e7629::Stop
                    (ctx,&prev->super_SynBase,
                     "ERROR: there is already a type or an alias with the same name");
        }
      }
    }
    uVar4 = InplaceStr::hash((InplaceStr *)auStack_68);
    originalDefinition_1 = (TypeClass *)anon_unknown.dwarf_e7629::LookupTypeByName(ctx,uVar4);
    if (originalDefinition_1 != (TypeClass *)0x0) {
      genericProtoType =
           (TypeGenericClassProto *)getType<TypeClass>((TypeBase *)originalDefinition_1);
      if ((TypeClass *)genericProtoType == (TypeClass *)0x0) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                   (ulong)(uint)((int)typeName.begin - auStack_68._0_4_));
      }
      else {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,&syntax->super_SynBase,
                   "ERROR: type \'%.*s\' was forward declared as a non-generic type",
                   (ulong)(uint)((int)typeName.begin - auStack_68._0_4_));
      }
    }
    this = ExpressionContext::get<TypeGenericClassProto>(ctx);
    SynIdentifier::SynIdentifier(&local_110,syntax->name,_auStack_68);
    TypeGenericClassProto::TypeGenericClassProto
              (this,&local_110,&syntax->super_SynBase,ctx->scope,syntax);
    SynIdentifier::~SynIdentifier(&local_110);
    local_c0 = this;
    ExpressionContext::AddType(ctx,&this->super_TypeBase);
    this_00 = ExpressionContext::get<ExprGenericClassPrototype>(ctx);
    ExprGenericClassPrototype::ExprGenericClassPrototype
              (this_00,&syntax->super_SynBase,ctx->typeVoid,local_c0);
    generics_local.tail = (TypeHandle *)this_00;
  }
  className.end._4_4_ = 1;
  NULLC::TraceScope::~TraceScope((TraceScope *)&curr);
  return (ExprBase *)generics_local.tail;
}

Assistant:

ExprBase* AnalyzeClassDefinition(ExpressionContext &ctx, SynClassDefinition *syntax, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	TRACE_SCOPE("analyze", "AnalyzeClassDefinition");
	TRACE_LABEL2(typeName.begin, typeName.end);

	if(!proto && !syntax->aliases.empty())
	{
		for(SynIdentifier *curr = syntax->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(LookupTypeByName(ctx, curr->name.hash()))
				Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");

			for(SynIdentifier *prev = syntax->aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
			{
				if(prev->name == curr->name)
					Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");
			}
		}

		if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
		{
			TypeClass *originalDefinition = getType<TypeClass>(type);

			if(originalDefinition)
				Stop(ctx, syntax, "ERROR: type '%.*s' was forward declared as a non-generic type", FMT_ISTR(typeName));
			else
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(typeName));
		}

		TypeGenericClassProto *genericProtoType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(SynIdentifier(syntax->name, typeName), syntax, ctx.scope, syntax);

		ctx.AddType(genericProtoType);

		return new (ctx.get<ExprGenericClassPrototype>()) ExprGenericClassPrototype(syntax, ctx.typeVoid, genericProtoType);
	}

	assert(generics.size() == syntax->aliases.size());

	InplaceStr className = generics.empty() ? typeName : GetGenericClassTypeName(ctx, proto, generics);

	if(className.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(ctx, syntax, "ERROR: generated type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	TypeClass *originalDefinition = NULL;

	if(TypeBase *type = LookupTypeByName(ctx, className.hash()))
	{
		originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		if(originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		for(ScopeData *scope = ctx.scope; scope; scope = scope->scope)
		{
			if(scope->ownerType == originalDefinition)
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));
		}
	}

	if(!generics.empty())
	{
		// Check if type already exists
		assert(ctx.genericTypeMap.find(className.hash()) == NULL);
	}

	unsigned alignment = syntax->align ? AnalyzeAlignment(ctx, syntax->align) : 0;

	IntrusiveList<MatchData> actualGenerics;

	{
		TypeHandle *currType = generics.head;
		SynIdentifier *currName = syntax->aliases.head;

		while(currType && currName)
		{
			assert(!isType<TypeError>(currType->type));

			actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(currName, currType->type));

			currType = currType->next;
			currName = getType<SynIdentifier>(currName->next);
		}
	}

	TypeClass *baseClass = NULL;

	if(syntax->baseClass)
	{
		ctx.PushTemporaryScope();

		for(MatchData *el = actualGenerics.head; el; el = el->next)
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

		TypeBase *type = AnalyzeType(ctx, syntax->baseClass);

		ctx.PopScope(SCOPE_TEMPORARY);

		if(!isType<TypeError>(type))
		{
			baseClass = getType<TypeClass>(type);

			if(!baseClass || !baseClass->extendable)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not extendable", FMT_ISTR(type->name));
		}
	}
	
	bool extendable = syntax->extendable || baseClass;

	TypeClass *classType = NULL;
	
	if(originalDefinition)
	{
		classType = originalDefinition;

		classType->extendable = extendable;
		classType->baseClass = baseClass;
	}
	else
	{
		classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, className), syntax, ctx.scope, proto, actualGenerics, extendable, baseClass);

		ctx.AddType(classType);
	}

	if(!generics.empty())
		ctx.genericTypeMap.insert(className.hash(), classType);

	ExprClassDefinition *classDefinition = new (ctx.get<ExprClassDefinition>()) ExprClassDefinition(syntax, ctx.typeVoid, classType);

	ctx.PushScope(classType);

	classType->typeScope = ctx.scope;

	for(MatchData *el = classType->generics.head; el; el = el->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

	// Base class adds a typeid member
	if(extendable)
	{
		unsigned offset = AllocateVariableInScope(ctx, syntax, ctx.typeTypeID->alignment, ctx.typeTypeID);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid"));

		VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, ctx.typeTypeID->alignment, ctx.typeTypeID, nameIdentifier, offset, ctx.uniqueVariableId++);

		ctx.AddVariable(member, false);

		classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, member, NULL));
	}

	if(baseClass)
	{
		// Use base class alignment at ths point to match member locations
		classType->alignment = baseClass->alignment;

		// Add members of base class
		for(MatchData *el = baseClass->aliases.head; el; el = el->next)
		{
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			classType->aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
		}

		AddBaseClassMemberVariables(ctx, syntax, baseClass, classType);

		for(ConstantData *el = baseClass->constants.head; el; el = el->next)
			classType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(el->name, el->value));

		FinalizeAlignment(classType);

		assert(classType->size == baseClass->size);
	}

	if(syntax->align)
		classType->alignment = alignment;

	AnalyzeClassElements(ctx, classDefinition, syntax->elements);

	ctx.PopScope(SCOPE_TYPE);

	return classDefinition;
}